

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O3

XYZ __thiscall pbrt::SampledSpectrum::ToXYZ(SampledSpectrum *this,SampledWavelengths *lambda)

{
  ulong uVar1;
  int i;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Float sum_1;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar10 [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar14 [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  float fVar15;
  Float sum;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  XYZ XVar21;
  SampledSpectrum SVar22;
  float local_40 [2];
  int iStack_38;
  int iStack_34;
  float local_30 [2];
  int iStack_28;
  int iStack_24;
  float local_20 [2];
  int iStack_18;
  int iStack_14;
  
  auVar14 = in_ZMM1._8_56_;
  auVar10 = in_ZMM0._8_56_;
  SVar22 = DenselySampledSpectrum::Sample(Spectra::x,lambda);
  auVar11._0_8_ = SVar22.values.values._8_8_;
  auVar11._8_56_ = auVar14;
  auVar7._0_8_ = SVar22.values.values._0_8_;
  auVar7._8_56_ = auVar10;
  SVar22 = DenselySampledSpectrum::Sample(Spectra::y,lambda);
  auVar12._0_8_ = SVar22.values.values._8_8_;
  auVar12._8_56_ = auVar14;
  auVar8._0_8_ = SVar22.values.values._0_8_;
  auVar8._8_56_ = auVar10;
  SVar22 = DenselySampledSpectrum::Sample(Spectra::z,lambda);
  auVar13._0_8_ = SVar22.values.values._8_8_;
  auVar13._8_56_ = auVar14;
  auVar9._0_8_ = SVar22.values.values._0_8_;
  auVar9._8_56_ = auVar10;
  auVar3 = *(undefined1 (*) [16])(lambda->pdf).values;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(lambda->pdf).values;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)((lambda->pdf).values + 2);
  lVar2 = 1;
  auVar4 = vunpcklpd_avx(auVar7._0_16_,auVar11._0_16_);
  auVar19._0_4_ = auVar4._0_4_ * (this->values).values[0];
  auVar19._4_4_ = auVar4._4_4_ * (this->values).values[1];
  auVar19._8_4_ = auVar4._8_4_ * (this->values).values[2];
  auVar19._12_4_ = auVar4._12_4_ * (this->values).values[3];
  uVar1 = vcmpps_avx512vl(auVar3,ZEXT816(0) << 0x40,4);
  auVar3 = vdivps_avx512vl(auVar19,auVar3);
  fVar15 = (float)((uint)((byte)uVar1 & 1) * auVar3._0_4_);
  local_20[1] = (float)((uint)((byte)(uVar1 >> 1) & 1) * auVar3._4_4_);
  iStack_18 = (uint)((byte)(uVar1 >> 2) & 1) * auVar3._8_4_;
  iStack_14 = (uint)((byte)(uVar1 >> 3) & 1) * auVar3._12_4_;
  do {
    fVar15 = fVar15 + local_20[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  auVar3 = vmovlhps_avx(auVar17,auVar18);
  lVar2 = 1;
  auVar4 = vunpcklpd_avx(auVar8._0_16_,auVar12._0_16_);
  uVar1 = vcmpps_avx512vl(auVar3,ZEXT816(0) << 0x20,4);
  auVar20._0_4_ = auVar4._0_4_ * (this->values).values[0];
  auVar20._4_4_ = auVar4._4_4_ * (this->values).values[1];
  auVar20._8_4_ = auVar4._8_4_ * (this->values).values[2];
  auVar20._12_4_ = auVar4._12_4_ * (this->values).values[3];
  auVar4 = vdivps_avx512vl(auVar20,auVar3);
  fVar16 = (float)((uint)((byte)uVar1 & 1) * auVar4._0_4_);
  local_30[1] = (float)((uint)((byte)(uVar1 >> 1) & 1) * auVar4._4_4_);
  iStack_28 = (uint)((byte)(uVar1 >> 2) & 1) * auVar4._8_4_;
  iStack_24 = (uint)((byte)(uVar1 >> 3) & 1) * auVar4._12_4_;
  do {
    fVar16 = fVar16 + local_30[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  auVar4 = vmovlhps_avx(auVar9._0_16_,auVar13._0_16_);
  auVar6._0_4_ = auVar4._0_4_ * (this->values).values[0];
  auVar6._4_4_ = auVar4._4_4_ * (this->values).values[1];
  auVar6._8_4_ = auVar4._8_4_ * (this->values).values[2];
  auVar6._12_4_ = auVar4._12_4_ * (this->values).values[3];
  lVar2 = 1;
  uVar1 = vcmpps_avx512vl(auVar3,ZEXT816(0) << 0x40,4);
  auVar3 = vdivps_avx512vl(auVar6,auVar3);
  fVar5 = (float)((uint)((byte)uVar1 & 1) * auVar3._0_4_);
  local_40[1] = (float)((uint)((byte)(uVar1 >> 1) & 1) * auVar3._4_4_);
  iStack_38 = (uint)((byte)(uVar1 >> 2) & 1) * auVar3._8_4_;
  iStack_34 = (uint)((byte)(uVar1 >> 3) & 1) * auVar3._12_4_;
  do {
    fVar5 = fVar5 + local_40[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  auVar3 = vinsertps_avx(ZEXT416((uint)fVar15),ZEXT416((uint)fVar16),0x10);
  auVar4._8_4_ = 0x3e800000;
  auVar4._0_8_ = 0x3e8000003e800000;
  auVar4._12_4_ = 0x3e800000;
  auVar4 = vmulps_avx512vl(auVar3,auVar4);
  auVar3._8_4_ = 0x42d5b6bb;
  auVar3._0_8_ = 0x42d5b6bb42d5b6bb;
  auVar3._12_4_ = 0x42d5b6bb;
  auVar3 = vdivps_avx512vl(auVar4,auVar3);
  XVar21.Z = (fVar5 * 0.25) / 106.856895;
  XVar21._0_8_ = auVar3._0_8_;
  return XVar21;
}

Assistant:

XYZ SampledSpectrum::ToXYZ(const SampledWavelengths &lambda) const {
    // Sample the $X$, $Y$, and $Z$ matching curves at _lambda_
    SampledSpectrum X = Spectra::X().Sample(lambda);
    SampledSpectrum Y = Spectra::Y().Sample(lambda);
    SampledSpectrum Z = Spectra::Z().Sample(lambda);

    // Evaluate estimator to compute $(x,y,z)$ coefficients
    SampledSpectrum pdf = lambda.PDF();
    return XYZ(SafeDiv(X * *this, pdf).Average(), SafeDiv(Y * *this, pdf).Average(),
               SafeDiv(Z * *this, pdf).Average()) /
           CIE_Y_integral;
}